

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

void __thiscall ear::Triplet::Triplet(Triplet *this,Vector3i *outputChannels,Matrix3d *positions)

{
  double *pdVar1;
  double dVar2;
  int *piVar3;
  undefined8 *puVar4;
  Index index;
  long lVar5;
  ulong uVar6;
  Matrix<double,_3,_3,_0,_3,_3> *other;
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> local_49;
  VectorXi local_48;
  DenseStorage<double,__1,__1,__1,_0> local_38;
  SrcXprType local_20;
  
  local_48.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)0x0
  ;
  local_48.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  free((void *)0x0);
  piVar3 = (int *)malloc(0xc);
  if (piVar3 == (int *)0x0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = std::random_device::_M_fini;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_48.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 3;
  lVar5 = 0;
  do {
    piVar3[lVar5] =
         (outputChannels->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.
         m_data.array[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_38.m_data = (double *)0x0;
  local_38.m_rows = 0;
  local_38.m_cols = 0;
  local_48.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = piVar3;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_38,9,3,3);
  if ((local_38.m_rows != 3) || (local_38.m_cols != 3)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_38,9,3,3);
  }
  if ((local_38.m_rows == 3) && (local_38.m_cols == 3)) {
    uVar6 = 0xfffffffffffffffe;
    do {
      pdVar1 = (positions->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array + uVar6 + 2;
      dVar2 = pdVar1[1];
      local_38.m_data[uVar6 + 2] = *pdVar1;
      (local_38.m_data + uVar6 + 2)[1] = dVar2;
      uVar6 = uVar6 + 2;
    } while (uVar6 < 6);
    lVar5 = 8;
    do {
      local_38.m_data[lVar5] =
           (positions->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
           m_data.array[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 9);
    RegionHandler::RegionHandler(&this->super_RegionHandler,&local_48,(MatrixXd *)&local_38);
    free(local_38.m_data);
    free(local_48.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    (this->super_RegionHandler)._vptr_RegionHandler = (_func_int **)&PTR_handle_001e3920;
    if ((this->super_RegionHandler)._positions.
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows !=
        (this->super_RegionHandler)._positions.
        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols) {
      __assert_fail("rows() == cols()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/LU/InverseImpl.h"
                    ,0x15f,
                    "const Inverse<Derived> Eigen::MatrixBase<Eigen::Matrix<double, -1, -1>>::inverse() const [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    local_20.m_xpr = &(this->super_RegionHandler)._positions;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&this->_basis,&local_20,&local_49);
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 3, 3>, T1 = double, T2 = double]"
               );
}

Assistant:

Triplet::Triplet(Eigen::Vector3i outputChannels, Eigen::Matrix3d positions)
      : RegionHandler(outputChannels, positions) {
    _basis = _positions.inverse();
  }